

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc.c
# Opt level: O2

Aig_Man_t * Saig_ManFramesBmc(Aig_Man_t *pAig,int nFrames)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  int iVar6;
  int iVar7;
  
  if (pAig->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc.c"
                  ,0x36,"Aig_Man_t *Saig_ManFramesBmc(Aig_Man_t *, int)");
  }
  p = Aig_ManStart((pAig->nObjs[6] + pAig->nObjs[5]) * nFrames);
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  for (iVar6 = 0; iVar6 < pAig->nRegs; iVar6 = iVar6 + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar6);
    *(ulong *)((long)pvVar3 + 0x28) = (ulong)p->pConst1 ^ 1;
  }
  iVar6 = nFrames + -1;
  iVar1 = 0;
  if (nFrames < 1) {
    nFrames = 0;
  }
  for (; iVar1 != nFrames; iVar1 = iVar1 + 1) {
    for (iVar7 = 0; iVar7 < pAig->nTruePis; iVar7 = iVar7 + 1) {
      pvVar3 = Vec_PtrEntry(pAig->vCis,iVar7);
      pAVar4 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
    }
    for (iVar7 = 0; iVar7 < pAig->vObjs->nSize; iVar7 = iVar7 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar7);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
        pAVar5 = Aig_ObjChild0Copy(pAVar4);
        p1 = Aig_ObjChild1Copy(pAVar4);
        pAVar5 = Aig_And(p,pAVar5,p1);
        (pAVar4->field_5).pData = pAVar5;
      }
    }
    for (iVar7 = 0; iVar7 < pAig->nTruePos; iVar7 = iVar7 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar7);
      pAVar4 = Aig_ObjChild0Copy(pAVar4);
      Aig_ObjCreateCo(p,pAVar4);
    }
    if (iVar1 == iVar6) break;
    for (iVar7 = 0; iVar2 = pAig->nRegs, iVar7 < iVar2; iVar7 = iVar7 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar7);
      pAVar5 = Aig_ObjChild0Copy(pAVar4);
      (pAVar4->field_5).pData = pAVar5;
    }
    for (iVar7 = 0; iVar7 < iVar2; iVar7 = iVar7 + 1) {
      pAVar4 = Saig_ManLi(pAig,iVar7);
      pAVar5 = Saig_ManLo(pAig,iVar7);
      pAVar5->field_5 = pAVar4->field_5;
      iVar2 = pAig->nRegs;
    }
  }
  Aig_ManCleanup(p);
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Create timeframes of the manager for BMC.]

  Description [The resulting manager is combinational. POs correspond to \
  the property outputs in each time-frame.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Saig_ManFramesBmc( Aig_Man_t * pAig, int nFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f;
    assert( Saig_ManRegNum(pAig) > 0 );
    pFrames = Aig_ManStart( Aig_ManNodeNum(pAig) * nFrames );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pFrames );
    // create variables for register outputs
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->pData = Aig_ManConst0( pFrames );
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // create PI nodes for this frame
        Saig_ManForEachPi( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi( pFrames );
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
            pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        // create POs for this frame
        Saig_ManForEachPo( pAig, pObj, i )
            Aig_ObjCreateCo( pFrames, Aig_ObjChild0Copy(pObj) );
        if ( f == nFrames - 1 )
            break;
        // save register inputs
        Saig_ManForEachLi( pAig, pObj, i )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        // transfer to register outputs
        Saig_ManForEachLiLo(  pAig, pObjLi, pObjLo, i )
            pObjLo->pData = pObjLi->pData;
    }
    Aig_ManCleanup( pFrames );
    return pFrames;
}